

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-mmap.cpp
# Opt level: O1

size_t __thiscall llama_file::impl::tell(impl *this)

{
  size_t sVar1;
  runtime_error *this_00;
  int *piVar2;
  char *pcVar3;
  string sStack_38;
  
  sVar1 = ftell((FILE *)this->fp);
  if (sVar1 != 0xffffffffffffffff) {
    return sVar1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  piVar2 = __errno_location();
  pcVar3 = strerror(*piVar2);
  format_abi_cxx11_(&sStack_38,"ftell error: %s",pcVar3);
  std::runtime_error::runtime_error(this_00,(string *)&sStack_38);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t tell() const {
// TODO: this ifdef is never true?
#ifdef _WIN32
        __int64 ret = _ftelli64(fp);
#else
        long ret = std::ftell(fp);
#endif
        if (ret == -1) {
            throw std::runtime_error(format("ftell error: %s", strerror(errno)));
        }

        return (size_t) ret;
    }